

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O2

ConstFaceVertexIter * __thiscall
OpenMesh::PolyConnectivity::cfv_end
          (ConstFaceVertexIter *__return_storage_ptr__,PolyConnectivity *this,FaceHandle _fh)

{
  uint uVar1;
  
  uVar1 = *(uint *)(*(long *)&this->field_0xf8 + (long)(int)_fh.super_BaseHandle.idx_ * 4);
  (__return_storage_ptr__->super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>).mesh_ = this;
  (__return_storage_ptr__->super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>).start_.
  super_BaseHandle.idx_ = uVar1;
  (__return_storage_ptr__->super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>).heh_.
  super_BaseHandle.idx_ = uVar1;
  (__return_storage_ptr__->super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>).lap_counter_ =
       ~uVar1 >> 0x1f;
  *(undefined4 *)
   &(__return_storage_ptr__->super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>).field_0x14 =
       0xffffffff;
  return __return_storage_ptr__;
}

Assistant:

ConstFaceVertexIter cfv_end(FaceHandle _fh) const
  { return ConstFaceVertexIter(*this, _fh, true); }